

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

void DumpStateHelper(FStateLabels *StateList,FString *prefix)

{
  FState **ppFVar1;
  FStateLabel *pFVar2;
  FState *pFVar3;
  PClassActor *pPVar4;
  FStateLabels *StateList_00;
  bool bVar5;
  PClass *pPVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  FString local_48;
  FStateLabel *local_40;
  
  if (0 < StateList->NumLabels) {
    local_40 = StateList->Labels;
    lVar9 = 0;
    pcVar7 = (char *)prefix;
    do {
      pFVar2 = local_40 + lVar9;
      pFVar3 = pFVar2->State;
      if (pFVar3 != (FState *)0x0) {
        if ((ulong)PClassActor::AllActorClasses.Count != 0) {
          uVar8 = 0;
          do {
            pPVar4 = PClassActor::AllActorClasses.Array[uVar8];
            if ((pFVar3 < pPVar4->OwnedStates) ||
               (pPVar4->OwnedStates + pPVar4->NumOwnedStates <= pFVar3)) {
              bVar5 = true;
            }
            else {
              bVar5 = false;
              pcVar7 = (char *)pPVar4;
            }
            if (!bVar5) goto LAB_00457345;
            uVar8 = uVar8 + 1;
          } while (PClassActor::AllActorClasses.Count != uVar8);
        }
        pcVar7 = (char *)0x0;
LAB_00457345:
        if ((PClassActor *)pcVar7 == (PClassActor *)0x0) {
          pcVar7 = "%s%s: invalid\n";
          Printf(5,"%s%s: invalid\n",prefix->Chars,
                 FName::NameData.NameArray[(pFVar2->Label).Index].Text);
        }
        else {
          pPVar6 = &((PClassActor *)pcVar7)->super_PClass;
          ppFVar1 = &((PClassActor *)pcVar7)->OwnedStates;
          pcVar7 = "%s%s: %s.%d\n";
          Printf(5,"%s%s: %s.%d\n",prefix->Chars,
                 FName::NameData.NameArray[(pFVar2->Label).Index].Text,
                 FName::NameData.NameArray
                 [(pPVar6->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text,
                 (ulong)(uint)((int)((ulong)((long)pFVar3 - (long)*ppFVar1) >> 3) * -0x33333333));
        }
      }
      StateList_00 = pFVar2->Children;
      if (StateList_00 != (FStateLabels *)0x0) {
        FString::operator+(&local_48,(char)prefix);
        FString::operator+((FString *)&stack0xffffffffffffffc8,(char *)&local_48);
        pcVar7 = (char *)&stack0xffffffffffffffc8;
        DumpStateHelper(StateList_00,(FString *)&stack0xffffffffffffffc8);
        FString::~FString((FString *)&stack0xffffffffffffffc8);
        FString::~FString(&local_48);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < StateList->NumLabels);
  }
  return;
}

Assistant:

void DumpStateHelper(FStateLabels *StateList, const FString &prefix)
{
	for (int i = 0; i < StateList->NumLabels; i++)
	{
		if (StateList->Labels[i].State != NULL)
		{
			const PClassActor *owner = FState::StaticFindStateOwner(StateList->Labels[i].State);
			if (owner == NULL)
			{
				Printf(PRINT_LOG, "%s%s: invalid\n", prefix.GetChars(), StateList->Labels[i].Label.GetChars());
			}
			else
			{
				Printf(PRINT_LOG, "%s%s: %s.%d\n", prefix.GetChars(), StateList->Labels[i].Label.GetChars(),
					owner->TypeName.GetChars(), int(StateList->Labels[i].State - owner->OwnedStates));
			}
		}
		if (StateList->Labels[i].Children != NULL)
		{
			DumpStateHelper(StateList->Labels[i].Children, prefix + '.' + StateList->Labels[i].Label.GetChars());
		}
	}
}